

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,LazyExpression *lazyExpr)

{
  bool bVar1;
  ostream *poVar2;
  LazyExpression *lazyExpr_local;
  ostream *os_local;
  
  if ((lazyExpr->m_isNegated & 1U) != 0) {
    std::operator<<(os,"!");
  }
  bVar1 = LazyExpression::operator_cast_to_bool(lazyExpr);
  if (bVar1) {
    if (((lazyExpr->m_isNegated & 1U) == 0) ||
       (bVar1 = ITransientExpression::isBinaryExpression(lazyExpr->m_transientExpression), !bVar1))
    {
      anon_unknown_1::operator<<(os,lazyExpr->m_transientExpression);
    }
    else {
      poVar2 = std::operator<<(os,"(");
      poVar2 = anon_unknown_1::operator<<(poVar2,lazyExpr->m_transientExpression);
      std::operator<<(poVar2,")");
    }
  }
  else {
    std::operator<<(os,"{** error - unchecked empty expression requested **}");
  }
  return os;
}

Assistant:

auto operator << ( std::ostream& os, LazyExpression const& lazyExpr ) -> std::ostream& {
        if( lazyExpr.m_isNegated )
            os << "!";

        if( lazyExpr ) {
            if( lazyExpr.m_isNegated && lazyExpr.m_transientExpression->isBinaryExpression() )
                os << "(" << *lazyExpr.m_transientExpression << ")";
            else
                os << *lazyExpr.m_transientExpression;
        }
        else {
            os << "{** error - unchecked empty expression requested **}";
        }
        return os;
    }